

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::anon_unknown_0::BasicAllTargetsAtomic::GenFSMS<unsigned_int>
          (string *__return_storage_ptr__,BasicAllTargetsAtomic *this,GLenum internalformat)

{
  ostream *poVar1;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream os;
  GLenum internalformat_local;
  BasicAllTargetsAtomic *this_local;
  
  os._372_4_ = internalformat;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,
                           "#version 420 core\nlayout(location = 0) out vec4 o_color;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1c8,(ShaderImageLoadStoreBase *)this,os._372_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<unsigned_int>
            (&local_1e8,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  poVar1 = std::operator<<(poVar1,"image2DMS g_image_2dms;\nlayout(");
  gl4cts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_208,(ShaderImageLoadStoreBase *)this,os._372_4_);
  poVar1 = std::operator<<(poVar1,(string *)&local_208);
  poVar1 = std::operator<<(poVar1,") coherent uniform ");
  ShaderImageLoadStoreBase::TypePrefix<unsigned_int>
            (&local_228,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_228);
  std::operator<<(poVar1,
                  "image2DMSArray g_image_2dms_array;\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  if (imageAtomicAdd(g_image_2dms, coord, 1, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMin(g_image_2dms, coord, 1, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMax(g_image_2dms, coord, 1, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicAnd(g_image_2dms, coord, 1, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicOr(g_image_2dms, coord, 1, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicXor(g_image_2dms, coord, 1, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_2dms, coord, 1, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicCompSwap(g_image_2dms, coord, 1, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_2dms, coord, 1, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n\n  if (imageAtomicAdd(g_image_2dms_array, ivec3(coord, 1), 1, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMin(g_image_2dms_array, ivec3(coord, 1), 1, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicMax(g_image_2dms_array, ivec3(coord, 1), 1, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicAnd(g_image_2dms_array, ivec3(coord, 1), 1, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicOr(g_image_2dms_array, ivec3(coord, 1), 1, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicXor(g_image_2dms_array, ivec3(coord, 1), 1, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_2dms_array, ivec3(coord, 1), 1, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicCompSwap(g_image_2dms_array, ivec3(coord, 1), 1, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n  if (imageAtomicExchange(g_image_2dms_array, ivec3(coord, 1), 1, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);\n}"
                 );
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string GenFSMS(GLenum internalformat)
	{
		std::ostringstream os;
		os << "#version 420 core" NL "layout(location = 0) out vec4 o_color;" NL "layout("
		   << FormatEnumToString(internalformat) << ") coherent uniform " << TypePrefix<T>()
		   << "image2DMS g_image_2dms;" NL "layout(" << FormatEnumToString(internalformat) << ") coherent uniform "
		   << TypePrefix<T>()
		   << "image2DMSArray g_image_2dms_array;" NL "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" NL
			  "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL
			  "  if (imageAtomicAdd(g_image_2dms, coord, 1, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicMin(g_image_2dms, coord, 1, 3) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicMax(g_image_2dms, coord, 1, 4) != 2) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicAnd(g_image_2dms, coord, 1, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicOr(g_image_2dms, coord, 1, 7) != 0) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicXor(g_image_2dms, coord, 1, 4) != 7) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicExchange(g_image_2dms, coord, 1, 1) != 3) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicCompSwap(g_image_2dms, coord, 1, 1, 6) != 1) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicExchange(g_image_2dms, coord, 1, 0) != 6) o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL NL
			  "  if (imageAtomicAdd(g_image_2dms_array, ivec3(coord, 1), 1, 2) != 0) o_color = vec4(1.0, 0.0, 0.0, "
			  "1.0);" NL "  if (imageAtomicMin(g_image_2dms_array, ivec3(coord, 1), 1, 3) != 2) o_color = vec4(1.0, "
			  "0.0, 0.0, 1.0);" NL "  if (imageAtomicMax(g_image_2dms_array, ivec3(coord, 1), 1, 4) != 2) "
			  "o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicAnd(g_image_2dms_array, ivec3(coord, 1), 1, 0) != 4) o_color = vec4(1.0, 0.0, 0.0, "
			  "1.0);" NL "  if (imageAtomicOr(g_image_2dms_array, ivec3(coord, 1), 1, 7) != 0) o_color = vec4(1.0, "
			  "0.0, 0.0, 1.0);" NL "  if (imageAtomicXor(g_image_2dms_array, ivec3(coord, 1), 1, 4) != 7) "
			  "o_color = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  if (imageAtomicExchange(g_image_2dms_array, ivec3(coord, 1), 1, 1) != 3) o_color = vec4(1.0, 0.0, "
			  "0.0, 1.0);" NL "  if (imageAtomicCompSwap(g_image_2dms_array, ivec3(coord, 1), 1, 1, 6) != 1) o_color = "
			  "vec4(1.0, 0.0, 0.0, 1.0);" NL "  if (imageAtomicExchange(g_image_2dms_array, "
			  "ivec3(coord, 1), 1, 0) != 6) o_color = vec4(1.0, 0.0, "
			  "0.0, 1.0);" NL "}";
		return os.str();
	}